

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getColMinAbsUnscaled
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i)

{
  undefined8 *puVar1;
  double a;
  int iVar2;
  DataArray<int> *pDVar3;
  DataArray<int> *pDVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  int iVar6;
  double *pdVar7;
  Item *pIVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<50U,_int,_void> local_e0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_68;
  
  pDVar3 = this->m_activeColscaleExp;
  pDVar4 = this->m_activeRowscaleExp;
  pIVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem +
           (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[i].idx;
  ::soplex::infinity::__tls_init();
  pdVar7 = (double *)__tls_get_addr(&PTR_003b6b60);
  a = *pdVar7;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,a);
  if (0 < (pIVar8->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    iVar2 = pDVar3->data[i];
    lVar10 = 0;
    lVar9 = 0;
    do {
      pNVar5 = (pIVar8->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_88 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar10 + 0x20);
      puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar10);
      local_a8 = *puVar1;
      uStack_a0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar10 + 0x10);
      local_98 = *puVar1;
      uStack_90 = puVar1[1];
      local_80 = *(undefined4 *)((long)&(pNVar5->val).m_backend.data + lVar10 + 0x28);
      local_7c = *(undefined1 *)((long)&(pNVar5->val).m_backend.data + lVar10 + 0x2c);
      local_78 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar10 + 0x30);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_68,(soplex *)&local_a8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)-(pDVar4->data
                                   [*(int *)((long)(&((pIVar8->data).
                                                                                                            
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar10)] + iVar2),
                 CONCAT31((int3)((uint)local_80 >> 8),local_7c));
      local_e0.neg = local_68.m_backend.neg;
      if (local_68.m_backend.neg == true) {
        local_e0.neg = local_68.m_backend.fpclass == cpp_dec_float_finite &&
                       local_68.m_backend.data._M_elems[0] == 0;
      }
      local_e0.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
      local_e0.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
      local_e0.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
      local_e0.data._M_elems[6] = local_68.m_backend.data._M_elems[6];
      local_e0.data._M_elems[7] = local_68.m_backend.data._M_elems[7];
      local_e0.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
      local_e0.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
      local_e0.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
      local_e0.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
      local_e0.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
      local_e0.exp = local_68.m_backend.exp;
      local_e0.fpclass = local_68.m_backend.fpclass;
      local_e0.prec_elem = local_68.m_backend.prec_elem;
      if (((local_68.m_backend.fpclass != cpp_dec_float_NaN) &&
          ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_e0,&__return_storage_ptr__->m_backend), iVar6 < 0)) {
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             CONCAT44(local_e0.data._M_elems[9],local_e0.data._M_elems[8]);
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             CONCAT44(local_e0.data._M_elems[5],local_e0.data._M_elems[4]);
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             CONCAT44(local_e0.data._M_elems[7],local_e0.data._M_elems[6]);
        *(ulong *)(__return_storage_ptr__->m_backend).data._M_elems =
             CONCAT44(local_e0.data._M_elems[1],local_e0.data._M_elems[0]);
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             CONCAT44(local_e0.data._M_elems[3],local_e0.data._M_elems[2]);
        (__return_storage_ptr__->m_backend).exp = local_e0.exp;
        (__return_storage_ptr__->m_backend).neg = local_e0.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_e0.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_e0.prec_elem;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x3c;
    } while (lVar9 < (pIVar8->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::getColMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nCols());
   assert(i >= 0);

   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& colVec = lp.LPColSetBase<R>::colVector(i);

   R min = R(infinity);
   int exp1;
   int exp2 = colscaleExp[i];

   for(int j = 0; j < colVec.size(); j++)
   {
      exp1 = rowscaleExp[colVec.index(j)];
      R abs = spxAbs(spxLdexp(colVec.value(j), -exp1 - exp2));

      if(abs < min)
         min = abs;
   }

   return min;
}